

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O0

uchar __thiscall bwtil::WaveletTree::charAt(WaveletTree *this,ulint i)

{
  uint uVar1;
  succinct_bitvector *this_00;
  ulong i_00;
  ulint uVar2;
  ulint in_RSI;
  succinct_bitvector *in_RDI;
  uint bit;
  uint level;
  ulint node;
  uchar c;
  uint uVar3;
  uchar local_11;
  succinct_bitvector *this_01;
  
  local_11 = '\0';
  this_01 = in_RDI;
  this_00 = (succinct_bitvector *)root((WaveletTree *)in_RDI);
  uVar3 = 0;
  while( true ) {
    i_00 = (ulong)uVar3;
    uVar2 = height((WaveletTree *)in_RDI);
    if (uVar2 <= i_00) break;
    std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator[]
              ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
               &in_RDI->bitvector,(size_type)this_00);
    uVar1 = succinct_bitvector::at(in_RDI,i_00);
    local_11 = local_11 * '\x02' + (char)uVar1;
    if (uVar1 == 0) {
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator[]
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 &in_RDI->bitvector,(size_type)this_00);
      in_RSI = succinct_bitvector::rank0(this_00,CONCAT44(uVar3,uVar1));
      this_00 = (succinct_bitvector *)child0((WaveletTree *)in_RDI,(ulint)this_00);
    }
    else {
      std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator[]
                ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
                 &in_RDI->bitvector,(size_type)this_00);
      in_RSI = succinct_bitvector::rank1(this_01,in_RSI);
      this_00 = (succinct_bitvector *)child1((WaveletTree *)in_RDI,(ulint)this_00);
    }
    uVar3 = uVar3 + 1;
  }
  return local_11;
}

Assistant:

inline uchar charAt(ulint i){

		uchar c=0;
		ulint node = root();
		uint level = 0;
		uint bit=0;

		while(level<height()){

			bit = nodes[node].at(i);
			c = c*2 + bit;

			if(bit==0){

				i = nodes[node].rank0(i);

				assert(i<nodes[node].size());

				node = child0(node);

			}else{

				i = nodes[node].rank1(i);

				assert(i<nodes[node].size());

				node = child1(node);

			}

			level++;

		}

		return c;

	}